

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_usadd_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b)

{
  TCGv_i64 v1;
  uintptr_t o;
  
  v1 = tcg_const_i64_tricore(tcg_ctx,-1);
  tcg_gen_add_i64(tcg_ctx,d,a,b);
  tcg_gen_movcond_i64_tricore(tcg_ctx,TCG_COND_LTU,d,d,a,v1,d);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(v1 + (long)tcg_ctx));
  return;
}

Assistant:

static void tcg_gen_usadd_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b)
{
    TCGv_i64 max = tcg_const_i64(tcg_ctx, -1);
    tcg_gen_add_i64(tcg_ctx, d, a, b);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LTU, d, d, a, max, d);
    tcg_temp_free_i64(tcg_ctx, max);
}